

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task6.cpp
# Opt level: O0

int main(void)

{
  istream *piVar1;
  ostream *poVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ostream *local_40;
  ostream *local_38;
  double D;
  double c;
  double b;
  double a;
  
  a._4_4_ = 0;
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&b);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&c);
  std::istream::operator>>(piVar1,&D);
  if ((b != 0.0) || (NAN(b))) {
    dVar4 = c * c + -(b * 4.0 * D);
    if (0.0 <= dVar4) {
      if ((dVar4 != 0.0) || (NAN(dVar4))) {
        poVar2 = std::operator<<((ostream *)&std::cout,"X1 = ");
        dVar3 = -c;
        dVar5 = sqrt(dVar4);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,((dVar3 + dVar5) / 2.0) / b);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<(poVar2,"X1 = ");
        dVar4 = sqrt(dVar4);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,((-c - dVar4) / 2.0) / b);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"X = ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(-c / 2.0) / b);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_ad0);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    if ((c != 0.0) || (NAN(c))) {
      poVar2 = std::operator<<((ostream *)&std::cout,"X = ");
      local_40 = (ostream *)std::ostream::operator<<(poVar2,-D / c);
    }
    else {
      if ((D != 0.0) || (NAN(D))) {
        local_38 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_aa4);
      }
      else {
        local_38 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_a81);
      }
      local_40 = local_38;
    }
    std::ostream::operator<<(local_40,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int
 main (void)
 {
    double a,b,c;
    cin >> a >> b >> c;
    if (!a) // первый коэф нуль
    {
        (!b ? (!c ? cout << "Бесконечно много решений" : cout << "решений нет") : cout << "X = " << -c / b) << endl;
    }
    else
    {
        double D = b*b - 4*a*c;
        if (D<0)
        {
            cout << "Корней нет" << endl;
        }
        else {
            !D ? cout << "X = " << -b / 2 / a << endl : cout << "X1 = " << (-b + sqrt(D)) / 2 / a << endl << "X1 = "
                                                             << (-b - sqrt(D)) / 2 / a << endl;
        }
    }

    return 0;
}